

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int FreeEXRHeader(EXRHeader *exr_header)

{
  uchar **ppuVar1;
  long lVar2;
  
  if (exr_header != (EXRHeader *)0x0) {
    if (exr_header->channels != (EXRChannelInfo *)0x0) {
      free(exr_header->channels);
    }
    if (exr_header->pixel_types != (int *)0x0) {
      free(exr_header->pixel_types);
    }
    if (exr_header->requested_pixel_types != (int *)0x0) {
      free(exr_header->requested_pixel_types);
    }
    if (0 < exr_header->num_custom_attributes) {
      ppuVar1 = &exr_header->custom_attributes[0].value;
      lVar2 = 0;
      do {
        if (*ppuVar1 != (uchar *)0x0) {
          free(*ppuVar1);
        }
        lVar2 = lVar2 + 1;
        ppuVar1 = ppuVar1 + 0x42;
      } while (lVar2 < exr_header->num_custom_attributes);
    }
    return 0;
  }
  return -3;
}

Assistant:

int FreeEXRHeader(EXRHeader *exr_header) {
  if (exr_header == NULL) {
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->channels) {
    free(exr_header->channels);
  }

  if (exr_header->pixel_types) {
    free(exr_header->pixel_types);
  }

  if (exr_header->requested_pixel_types) {
    free(exr_header->requested_pixel_types);
  }

  for (int i = 0; i < exr_header->num_custom_attributes; i++) {
    if (exr_header->custom_attributes[i].value) {
      free(exr_header->custom_attributes[i].value);
    }
  }

  return TINYEXR_SUCCESS;
}